

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O3

void __thiscall
spdlog::details::registry::set_levels(registry *this,log_levels *levels,level_enum *global_level)

{
  int iVar1;
  iterator iVar2;
  level_enum *plVar3;
  _Hash_node_base *p_Var4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(this->log_levels_)._M_h,levels);
  plVar3 = &this->global_log_level_;
  if (global_level != (level_enum *)0x0) {
    plVar3 = global_level;
  }
  this->global_log_level_ = *plVar3;
  p_Var4 = (this->loggers_)._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var4 == (_Hash_node_base *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->log_levels_)._M_h,(key_type *)(p_Var4 + 1));
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
        ._M_cur == (__node_type *)0x0) {
      plVar3 = global_level;
      if (global_level != (level_enum *)0x0) goto LAB_0017afde;
    }
    else {
      plVar3 = (level_enum *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                      ._M_cur + 0x28);
LAB_0017afde:
      LOCK();
      *(level_enum *)&p_Var4[5]._M_nxt[8]._M_nxt = *plVar3;
      UNLOCK();
    }
    p_Var4 = p_Var4->_M_nxt;
  } while( true );
}

Assistant:

SPDLOG_INLINE void registry::set_levels(log_levels levels, level::level_enum *global_level)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    log_levels_ = std::move(levels);
    auto global_level_requested = global_level != nullptr;
    global_log_level_ = global_level_requested ? *global_level : global_log_level_;

    for (auto &logger : loggers_)
    {
        auto logger_entry = log_levels_.find(logger.first);
        if (logger_entry != log_levels_.end())
        {
            logger.second->set_level(logger_entry->second);
        }
        else if (global_level_requested)
        {
            logger.second->set_level(*global_level);
        }
    }
}